

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

RunnerContext * SetNodeValue(Runner *runner,ASTNode *node)

{
  Token TVar1;
  ASTNode *pAVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  RunnerContext *pRVar5;
  RunnerContext *pRVar6;
  ulong uVar7;
  void *callstack [128];
  undefined1 auStack_438 [1032];
  
  if (node == (ASTNode *)0x0) {
    printf("Invalid Check: %s in %s:%d\n","node != NULL","SetNodeValue",0xaa);
    uVar3 = backtrace(auStack_438,0x80);
    __ptr = (void *)backtrace_symbols(auStack_438,uVar3);
    if (0 < (int)uVar3) {
      uVar7 = 0;
      do {
        puts(*(char **)((long)__ptr + uVar7 * 8));
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    free(__ptr);
  }
  lVar4 = (long)runner->totalContexts;
  if (0 < lVar4) {
    pRVar5 = runner->contexts;
    do {
      if ((pRVar5->node != (ASTNode *)0x0) && (pRVar5->node->id == node->id)) {
        return pRVar5;
      }
      pRVar5 = pRVar5 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  pRVar5 = GetNextContext(runner);
  pRVar5->node = node;
  TVar1 = node->type;
  switch(TVar1) {
  case BOOLEAN:
    pRVar5->dataType = BOOLEAN;
    goto LAB_0010626f;
  case BYTE:
    pRVar5->dataType = BYTE;
    goto LAB_0010626f;
  case SHORT:
    pRVar5->dataType = SHORT;
    (pRVar5->value).vShort = (node->meta).shortExpr.value;
    break;
  case INT:
    pRVar5->dataType = INT;
    (pRVar5->value).vInt = (node->meta).intExpr.value;
    break;
  case FLOAT:
    pRVar5->dataType = FLOAT;
    (pRVar5->value).vInt = (node->meta).intExpr.value;
    break;
  case DOUBLE:
    pRVar5->dataType = DOUBLE;
    pRVar5->value = (anon_union_8_9_f6e6a019_for_value)(node->meta).doubleExpr.value;
    break;
  case LONG:
    pRVar5->dataType = LONG;
    goto LAB_0010625d;
  case END_NUMBER:
  case BEGIN_STRING:
    break;
  case CHAR:
    pRVar5->dataType = CHAR;
LAB_0010626f:
    (pRVar5->value).vBoolean = (node->meta).booleanExpr.value;
    break;
  case STRING:
    pRVar5->dataType = STRING;
LAB_0010625d:
    pRVar5->value = (anon_union_8_9_f6e6a019_for_value)(node->meta).doubleExpr.value;
    break;
  default:
    if (TVar1 == VAR) {
      RunSetVarType(runner,pRVar5,node);
    }
    else if (TVar1 == FUNC_CALL) {
      pAVar2 = runner->currentNode;
      runner->currentNode = node;
      pRVar6 = RunFuncWithArgs(runner,(node->meta).binaryExpr.left,(node->meta).funcCallExpr.args);
      runner->currentNode = pAVar2;
      pRVar5->dataType = pRVar6->dataType;
      pRVar5->value = pRVar6->value;
      runner->contextUsed[(long)pRVar6->id + -1] = false;
      pRVar6->node = (ASTNode *)0x0;
      pRVar6->dataType = UNDEFINED;
    }
  }
  return pRVar5;
}

Assistant:

RunnerContext* SetNodeValue(Runner* runner, ASTNode* node){
  CHECK(node != NULL);
  RunnerContext* context = GetContextByNodeId(runner, node->id);
  if (context != NULL){
    return context;
  }

  context = GetNextContext(runner);
  context->node = node;

  int type = (int) node->type;
  switch (type) {
    case BOOLEAN: {
      context->dataType = node->type;
      context->value.vBoolean = GET_BOOLEAN_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vBoolean);
      break;
    }
    case BYTE: {
      context->dataType = BYTE;
      context->value.vByte = GET_BYTE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vByte);
      break;
    }
    case SHORT: {
      context->dataType = SHORT;
      context->value.vShort = GET_SHORT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vShort);
      break;
    }
    case INT: {
      context->dataType = INT;
      context->value.vInt = GET_INT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vInt);
      break;
    }
    case FLOAT: {
      context->dataType = FLOAT;
      context->value.vFloat = GET_FLOAT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vFloat);
      break;
    }
    case DOUBLE: {
      context->dataType = DOUBLE;
      context->value.vDouble = GET_DOUBLE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vDouble);
      break;
    }
    case LONG: {
      context->dataType = LONG;
      context->value.vLong = GET_LONG_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %ld\n", context->value.vLong);
      break;
    }
    case CHAR: {
      context->dataType = CHAR;
      context->value.vChar = GET_CHAR_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %c\n", context->value.vChar);
      break;
    }
    case STRING: {
      context->dataType = STRING;
      context->value.vString = GET_STRING_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %s\n", context->value.vString);
      break;
    }
    case VAR: {
      RunSetVarType(runner, context, node);
      break;
    }
    case FUNC_CALL: {
      ASTNode* previousNode = runner->currentNode;
      runner->currentNode = node;
      RunnerContext* newContext = RunFuncCall(runner);
      runner->currentNode = previousNode;
      MergeContextValues(newContext, context);
      GCContext(runner, newContext);
      break;
    }
  }

  return context;
}